

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoWriter::InvalidValue
          (ProtoWriter *this,StringPiece type_name,StringPiece value)

{
  ProtoElement *pPVar1;
  LocationTrackerInterface *pLVar2;
  
  pPVar1 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
           ._M_head_impl;
  if (pPVar1 == (ProtoElement *)0x0) {
    pLVar2 = (this->tracker_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
             ._M_head_impl;
  }
  else {
    pLVar2 = &pPVar1->super_LocationTrackerInterface;
  }
  (*this->listener_->_vptr_ErrorListener[3])
            (this->listener_,pLVar2,type_name.ptr_,type_name.length_,value.ptr_,value.length_);
  return;
}

Assistant:

void ProtoWriter::InvalidValue(StringPiece type_name,
                               StringPiece value) {
  listener_->InvalidValue(location(), type_name, value);
}